

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::SACSubcaseBase::CheckGetCommands
          (SACSubcaseBase *this,GLenum e,GLint expected)

{
  bool bVar1;
  CallLogWrapper *this_00;
  GLboolean b;
  GLfloat f;
  GLint i;
  GLdouble d;
  GLint64 i64;
  byte local_39;
  float local_38;
  uint local_34;
  double local_30;
  long local_28;
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92c1,(GLint *)&local_34);
  if (local_34 != e) {
    anon_unknown_0::Output
              ("%s state is incorrect (GetIntegerv, is: %d, expected: %d)\n",
               "GL_ATOMIC_COUNTER_BUFFER_BINDING",(ulong)local_34,e);
  }
  glu::CallLogWrapper::glGetInteger64v(this_00,0x92c1,&local_28);
  if (local_28 != (int)e) {
    anon_unknown_0::Output
              ("%s state is incorrect (GetInteger64v, is: %d, expected: %d)\n",
               "GL_ATOMIC_COUNTER_BUFFER_BINDING",local_28,e);
  }
  bVar1 = local_28 == (int)e && local_34 == e;
  glu::CallLogWrapper::glGetFloatv(this_00,0x92c1,&local_38);
  if ((local_38 != (float)(int)e) || (NAN(local_38) || NAN((float)(int)e))) {
    anon_unknown_0::Output
              ("%s state is incorrect (GetFloatv, is: %f, expected: %d)\n",(double)local_38,
               "GL_ATOMIC_COUNTER_BUFFER_BINDING",e);
    bVar1 = false;
  }
  glu::CallLogWrapper::glGetDoublev(this_00,0x92c1,&local_30);
  if ((local_30 != (double)(int)e) || (NAN(local_30) || NAN((double)(int)e))) {
    anon_unknown_0::Output
              ("%s state is incorrect (GetDoublev, is: %f, expected: %d)\n",
               "GL_ATOMIC_COUNTER_BUFFER_BINDING",e);
    bVar1 = false;
  }
  glu::CallLogWrapper::glGetBooleanv(this_00,0x92c1,&local_39);
  if ((bool)local_39 != (e != 0)) {
    bVar1 = false;
    anon_unknown_0::Output
              ("%s state is incorrect (GetBooleanv, is: %d, expected: %d)\n",
               "GL_ATOMIC_COUNTER_BUFFER_BINDING",(ulong)local_39,(ulong)(e != 0));
  }
  return bVar1;
}

Assistant:

bool CheckGetCommands(GLenum e, GLint expected)
	{
		bool ok = true;

		GLint i;
		glGetIntegerv(e, &i);
		if (i != expected)
		{
			ok = false;
			Output("%s state is incorrect (GetIntegerv, is: %d, expected: %d)\n", GLenumToString(e), i, expected);
		}

		GLint64 i64;
		glGetInteger64v(e, &i64);
		if (i64 != static_cast<GLint64>(expected))
		{
			ok = false;
			Output("%s state is incorrect (GetInteger64v, is: %d, expected: %d)\n", GLenumToString(e),
				   static_cast<GLint>(i64), expected);
		}

		GLfloat f;
		glGetFloatv(e, &f);
		if (f != static_cast<GLfloat>(expected))
		{
			ok = false;
			Output("%s state is incorrect (GetFloatv, is: %f, expected: %d)\n", GLenumToString(e), f, expected);
		}

		GLdouble d;
		glGetDoublev(e, &d);
		if (d != static_cast<GLdouble>(expected))
		{
			ok = false;
			Output("%s state is incorrect (GetDoublev, is: %f, expected: %d)\n", GLenumToString(e), d, expected);
		}

		GLboolean b;
		glGetBooleanv(e, &b);
		if (b != (expected ? GL_TRUE : GL_FALSE))
		{
			ok = false;
			Output("%s state is incorrect (GetBooleanv, is: %d, expected: %d)\n", GLenumToString(e), b,
				   expected ? GL_TRUE : GL_FALSE);
		}

		return ok;
	}